

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O3

DirHandle * createDirHandle(PHYSFS_Io *io,char *newDir,char *mountPoint,int forWriting)

{
  _func_void_PHYSFS_Io_ptr *p_Var1;
  _func_void_void_ptr *p_Var2;
  _func_void_ptr_PHYSFS_uint64 *p_Var3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  undefined8 *puVar7;
  undefined8 uVar8;
  char *pcVar9;
  void *pvVar10;
  PHYSFS_Archiver *pPVar11;
  DirHandle *pDVar12;
  ErrState *pEVar13;
  PHYSFS_Io *io_00;
  PHYSFS_ErrorCode errcode;
  undefined8 *puVar14;
  void **retval;
  char *dst;
  PHYSFS_Archiver **ppPVar15;
  bool bVar16;
  undefined8 uStack_78;
  PHYSFS_Stat local_70;
  PHYSFS_Io *local_48;
  char *local_40;
  int local_38;
  int local_34 [2];
  int claimed;
  
  puVar14 = &uStack_78;
  local_38 = forWriting;
  if (mountPoint == (char *)0x0) {
    dst = (char *)0x0;
  }
  else {
    sVar6 = strlen(mountPoint);
    if (sVar6 + 1 < 0x100) {
      puVar7 = (undefined8 *)((long)&uStack_78 - (sVar6 + 0x18 & 0xfffffffffffffff0));
      uVar8 = 0;
      puVar14 = puVar7;
    }
    else {
      puVar7 = (undefined8 *)(*__PHYSFS_AllocatorHooks.Malloc)(sVar6 + 9);
      if (puVar7 == (undefined8 *)0x0) {
        PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
        return (DirHandle *)0x0;
      }
      uVar8 = 1;
      puVar14 = &uStack_78;
    }
    *puVar7 = uVar8;
    dst = (char *)(puVar7 + 1);
    puVar14[-1] = 0x107839;
    iVar4 = sanitizePlatformIndependentPath(mountPoint,dst);
    if (iVar4 == 0) goto LAB_00107bae;
  }
  local_34[0] = 0;
  io_00 = io;
  if (io == (PHYSFS_Io *)0x0) {
    puVar14[-1] = 0x10791a;
    iVar5 = __PHYSFS_platformStat(newDir,&local_70,1);
    iVar4 = local_38;
    if (iVar5 != 0) {
      if (local_70.filetype == PHYSFS_FILETYPE_DIRECTORY) {
        puVar14[-1] = 0x10793e;
        pvVar10 = DIR_openArchive((PHYSFS_Io *)0x0,newDir,iVar4,local_34);
        if (pvVar10 == (void *)0x0) {
LAB_00107b80:
          if (local_34[0] != 0) goto LAB_00107ba9;
          goto LAB_00107b86;
        }
        puVar14[-1] = 0x107958;
        pDVar12 = (DirHandle *)(*__PHYSFS_AllocatorHooks.Malloc)(0x38);
        if (pDVar12 == (DirHandle *)0x0) {
          puVar14[-1] = 0x107b7d;
          DIR_closeArchive(pvVar10);
          goto LAB_00107b80;
        }
        pDVar12->funcs = (PHYSFS_Archiver *)0x0;
        pDVar12->next = (__PHYSFS_DIRHANDLE__ *)0x0;
        pDVar12->root = (char *)0x0;
        pDVar12->rootlen = 0;
        pDVar12->dirName = (char *)0x0;
        pDVar12->mountPoint = (char *)0x0;
        pDVar12->funcs = &__PHYSFS_Archiver_DIR;
        pDVar12->opaque = pvVar10;
        goto LAB_00107a73;
      }
LAB_00107b86:
      bVar16 = local_38 != 0;
      puVar14[-1] = 0x107b9d;
      io_00 = __PHYSFS_createNativeIo(newDir,(uint)bVar16 * 5 + 0x72);
      if (io_00 != (PHYSFS_Io *)0x0) goto LAB_00107854;
    }
  }
  else {
LAB_00107854:
    puVar14[-1] = 0x107861;
    pcVar9 = strchr(newDir,0x2e);
    local_48 = io;
    local_40 = dst;
    if (pcVar9 == (char *)0x0) {
      pPVar11 = *archivers;
      pDVar12 = (DirHandle *)0x0;
      if ((pPVar11 != (PHYSFS_Archiver *)0x0) && (local_34[0] == 0)) {
        ppPVar15 = archivers;
        do {
          iVar4 = local_38;
          ppPVar15 = ppPVar15 + 1;
          puVar14[-1] = 0x1079bf;
          pDVar12 = tryOpenDir(io_00,pPVar11,newDir,iVar4,local_34);
          pPVar11 = *ppPVar15;
          if ((pPVar11 == (PHYSFS_Archiver *)0x0) || (pDVar12 != (DirHandle *)0x0)) break;
        } while (local_34[0] == 0);
      }
    }
    else {
      do {
        puVar14[-1] = 0x107885;
        pcVar9 = strchr(pcVar9 + 1,0x2e);
      } while (pcVar9 != (char *)0x0);
      pPVar11 = *archivers;
      ppPVar15 = archivers;
      if (local_34[0] == 0 && pPVar11 != (PHYSFS_Archiver *)0x0) {
        do {
          puVar14[-1] = 0x1078c0;
          iVar5 = PHYSFS_utf8stricmp((char *)*puVar14,(char *)puVar14[-1]);
          iVar4 = local_38;
          if (iVar5 == 0) {
            pPVar11 = *ppPVar15;
            puVar14[-1] = 0x1078df;
            pDVar12 = tryOpenDir(io_00,pPVar11,newDir,iVar4,local_34);
          }
          else {
            pDVar12 = (DirHandle *)0x0;
          }
        } while (((ppPVar15[1] != (PHYSFS_Archiver *)0x0) && (pDVar12 == (DirHandle *)0x0)) &&
                (ppPVar15 = ppPVar15 + 1, local_34[0] == 0));
        pPVar11 = *archivers;
      }
      else {
        pDVar12 = (DirHandle *)0x0;
      }
      ppPVar15 = archivers;
      if ((local_34[0] == 0 && pDVar12 == (DirHandle *)0x0) && pPVar11 != (PHYSFS_Archiver *)0x0) {
        do {
          puVar14[-1] = 0x107a0a;
          iVar5 = PHYSFS_utf8stricmp((char *)*puVar14,(char *)puVar14[-1]);
          iVar4 = local_38;
          if (iVar5 == 0) {
            pDVar12 = (DirHandle *)0x0;
          }
          else {
            pPVar11 = *ppPVar15;
            puVar14[-1] = 0x107a24;
            pDVar12 = tryOpenDir(io_00,pPVar11,newDir,iVar4,local_34);
          }
        } while (((ppPVar15[1] != (PHYSFS_Archiver *)0x0) && (pDVar12 == (DirHandle *)0x0)) &&
                (ppPVar15 = ppPVar15 + 1, local_34[0] == 0));
      }
    }
    puVar14[-1] = 0x107a48;
    pEVar13 = findErrorForCurrentThread();
    dst = local_40;
    if (pEVar13 == (ErrState *)0x0) {
      errcode = PHYSFS_ERR_OK;
    }
    else {
      errcode = pEVar13->code;
    }
    local_48 = (PHYSFS_Io *)((ulong)local_48 | (ulong)pDVar12);
    if (local_48 == (PHYSFS_Io *)0x0) {
      p_Var1 = io_00->destroy;
      puVar14[-1] = 0x107a65;
      (*p_Var1)(io_00);
    }
    else if (pDVar12 != (DirHandle *)0x0) {
LAB_00107a73:
      p_Var3 = __PHYSFS_AllocatorHooks.Malloc;
      puVar14[-1] = 0x107a82;
      sVar6 = strlen(newDir);
      puVar14[-1] = 0x107a88;
      pcVar9 = (char *)(*p_Var3)(sVar6 + 1);
      pDVar12->dirName = pcVar9;
      if (pcVar9 != (char *)0x0) {
        puVar14[-1] = 0x107aa0;
        strcpy(pcVar9,newDir);
        p_Var3 = __PHYSFS_AllocatorHooks.Malloc;
        if (dst == (char *)0x0) {
          return pDVar12;
        }
        if (*dst == '\0') {
LAB_00107aea:
          if (*(long *)(dst + -8) != 0) {
            puVar14[-1] = 0x107b02;
            (*__PHYSFS_AllocatorHooks.Free)(dst + -8);
            return pDVar12;
          }
          return pDVar12;
        }
        puVar14[-1] = 0x107abe;
        sVar6 = strlen(dst);
        puVar14[-1] = 0x107ac4;
        pcVar9 = (char *)(*p_Var3)(sVar6 + 2);
        pDVar12->mountPoint = pcVar9;
        if (pcVar9 != (char *)0x0) {
          puVar14[-1] = 0x107ad8;
          strcpy(pcVar9,dst);
          pcVar9 = pDVar12->mountPoint;
          puVar14[-1] = 0x107ae4;
          sVar6 = strlen(pcVar9);
          pcVar9 = pcVar9 + sVar6;
          pcVar9[0] = '/';
          pcVar9[1] = '\0';
          goto LAB_00107aea;
        }
      }
      puVar14[-1] = 0x107b4b;
      PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
      pvVar10 = pDVar12->opaque;
      p_Var2 = pDVar12->funcs->closeArchive;
      puVar14[-1] = 0x107b55;
      (*p_Var2)(pvVar10);
      pcVar9 = pDVar12->dirName;
      puVar14[-1] = 0x107b5f;
      (*__PHYSFS_AllocatorHooks.Free)(pcVar9);
      pcVar9 = pDVar12->mountPoint;
      puVar14[-1] = 0x107b69;
      (*__PHYSFS_AllocatorHooks.Free)(pcVar9);
      puVar14[-1] = 0x107b72;
      (*__PHYSFS_AllocatorHooks.Free)(pDVar12);
      goto LAB_00107ba9;
    }
    if (errcode != PHYSFS_ERR_OK || local_34[0] == 0) {
      if (local_34[0] == 0) {
        errcode = PHYSFS_ERR_UNSUPPORTED;
      }
      puVar14[-1] = 0x107b30;
      PHYSFS_setErrorCode(errcode);
    }
  }
LAB_00107ba9:
  if (dst == (char *)0x0) {
    return (DirHandle *)0x0;
  }
LAB_00107bae:
  if (*(long *)(dst + -8) != 0) {
    *(undefined8 *)((long)puVar14 + -8) = 0x107bc2;
    (*__PHYSFS_AllocatorHooks.Free)(dst + -8);
  }
  return (DirHandle *)0x0;
}

Assistant:

static DirHandle *createDirHandle(PHYSFS_Io *io, const char *newDir,
                                  const char *mountPoint, int forWriting)
{
    DirHandle *dirHandle = NULL;
    char *tmpmntpnt = NULL;

    assert(newDir != NULL);  /* should have caught this higher up. */

    if (mountPoint != NULL)
    {
        const size_t len = strlen(mountPoint) + 1;
        tmpmntpnt = (char *) __PHYSFS_smallAlloc(len);
        GOTO_IF(!tmpmntpnt, PHYSFS_ERR_OUT_OF_MEMORY, badDirHandle);
        if (!sanitizePlatformIndependentPath(mountPoint, tmpmntpnt))
            goto badDirHandle;
        mountPoint = tmpmntpnt;  /* sanitized version. */
    } /* if */

    dirHandle = openDirectory(io, newDir, forWriting);
    GOTO_IF_ERRPASS(!dirHandle, badDirHandle);

    dirHandle->dirName = (char *) allocator.Malloc(strlen(newDir) + 1);
    GOTO_IF(!dirHandle->dirName, PHYSFS_ERR_OUT_OF_MEMORY, badDirHandle);
    strcpy(dirHandle->dirName, newDir);

    if ((mountPoint != NULL) && (*mountPoint != '\0'))
    {
        dirHandle->mountPoint = (char *)allocator.Malloc(strlen(mountPoint)+2);
        if (!dirHandle->mountPoint)
            GOTO(PHYSFS_ERR_OUT_OF_MEMORY, badDirHandle);
        strcpy(dirHandle->mountPoint, mountPoint);
        strcat(dirHandle->mountPoint, "/");
    } /* if */

    __PHYSFS_smallFree(tmpmntpnt);
    return dirHandle;

badDirHandle:
    if (dirHandle != NULL)
    {
        dirHandle->funcs->closeArchive(dirHandle->opaque);
        allocator.Free(dirHandle->dirName);
        allocator.Free(dirHandle->mountPoint);
        allocator.Free(dirHandle);
    } /* if */

    __PHYSFS_smallFree(tmpmntpnt);
    return NULL;
}